

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClosedFileInputSource.cc
# Opt level: O2

void __thiscall ClosedFileInputSource::~ClosedFileInputSource(ClosedFileInputSource *this)

{
  ~ClosedFileInputSource(this);
  operator_delete(this,0xe8);
  return;
}

Assistant:

ClosedFileInputSource::~ClosedFileInputSource() // NOLINT (modernize-use-equals-default)
{
    // Must be explicit and not inline -- see QPDF_DLL_CLASS in README-maintainer
}